

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::setStyle(QWizardPrivate *this,QStyle *style)

{
  bool bVar1;
  QMap<int,_QWizardPage_*> *in_RDI;
  long in_FS_OFFSET;
  QWidget *unaff_retaddr;
  int i;
  const_iterator it;
  const_iterator pcend;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  QStyle *style_00;
  
  style_00 = *(QStyle **)(in_FS_OFFSET + 0x28);
  for (iVar2 = 0; iVar2 < 9; iVar2 = iVar2 + 1) {
    if (in_RDI[(long)iVar2 + 0x84].d.d.ptr !=
        (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
         *)0x0) {
      QWidget::setStyle(unaff_retaddr,style_00);
    }
  }
  QMap<int,_QWizardPage_*>::constEnd(in_RDI);
  QMap<int,_QWizardPage_*>::constBegin(in_RDI);
  while( true ) {
    bVar1 = ::operator!=((const_iterator *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                         (const_iterator *)in_RDI);
    if (!bVar1) break;
    QMap<int,_QWizardPage_*>::const_iterator::value((const_iterator *)0x7ba2a7);
    QWidget::setStyle(unaff_retaddr,style_00);
    QMap<int,_QWizardPage_*>::const_iterator::operator++
              ((const_iterator *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
  }
  if (*(QStyle **)(in_FS_OFFSET + 0x28) == style_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::setStyle(QStyle *style)
{
    for (int i = 0; i < QWizard::NButtons; i++)
        if (btns[i])
            btns[i]->setStyle(style);
    const PageMap::const_iterator pcend = pageMap.constEnd();
    for (PageMap::const_iterator it = pageMap.constBegin(); it != pcend; ++it)
        it.value()->setStyle(style);
}